

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall
wasm::DataFlow::Graph::merge
          (Graph *this,
          vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
          *states,Locals *out)

{
  pointer pFVar1;
  Locals *pLVar2;
  Locals *pLVar3;
  size_t sVar4;
  Type TVar5;
  pointer pFVar6;
  Node *pNVar7;
  Node *pNVar8;
  pointer pFVar9;
  Index index;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  FlowState *state;
  long lVar14;
  bool bVar15;
  vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  *__range3;
  
  pFVar6 = (states->
           super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (states->
           super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pFVar9 = pFVar6;
  while (pFVar9 != pFVar1) {
    pLVar2 = &pFVar9->locals;
    pLVar3 = &pFVar9->locals;
    pFVar9 = pFVar9 + 1;
    if ((pLVar2->super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (pLVar3->super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!isInUnreachable(state.locals)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/graph.h"
                    ,0x296,"void wasm::DataFlow::Graph::merge(std::vector<FlowState> &, Locals &)");
    }
  }
  uVar11 = (ulong)((long)pFVar1 - (long)pFVar6) >> 5;
  iVar10 = (int)uVar11;
  if (iVar10 == 0) {
    if ((this->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("isInUnreachable()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/graph.h"
                    ,0x29c,"void wasm::DataFlow::Graph::merge(std::vector<FlowState> &, Locals &)");
    }
  }
  else {
    setInReachable(this);
    if (iVar10 == 1) {
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::operator=
                (out,&((states->
                       super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                       )._M_impl.super__Vector_impl_data._M_start)->locals);
      return;
    }
    sVar4 = Function::getNumLocals(this->func);
    __range3 = (vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                *)0x0;
    for (uVar13 = 0; uVar13 != (sVar4 & 0xffffffff); uVar13 = uVar13 + 1) {
      TVar5 = Function::getLocalType(this->func,(Index)uVar13);
      if ((TVar5.id & 0xfffffffffffffffe) == 2) {
        pFVar6 = (states->
                 super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pFVar1 = (states->
                 super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pFVar9 = pFVar6;
        do {
          if (pFVar9 == pFVar1) {
            pNVar7 = (Node *)0x0;
            goto LAB_00818723;
          }
          pNVar7 = (pFVar9->locals).
                   super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar13];
          pFVar9 = pFVar9 + 1;
        } while (pNVar7->type != Bad);
LAB_00818813:
        (out->super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>).
        _M_impl.super__Vector_impl_data._M_start[uVar13] = pNVar7;
      }
LAB_0081881e:
    }
  }
  return;
LAB_00818723:
  if (pFVar6 == pFVar1) goto LAB_0081881e;
  pNVar8 = (pFVar6->locals).
           super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar13];
  if (pNVar7 != (Node *)0x0) {
    bVar15 = pNVar8 == pNVar7;
    pNVar8 = pNVar7;
    if (bVar15) goto LAB_00818749;
    if (__range3 ==
        (vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
         *)0x0) {
      pNVar7 = Node::makeBlock();
      __range3 = (vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                  *)addNode(this,pNVar7);
      lVar14 = 0x18;
      for (uVar12 = 0; (uVar11 & 0xffffffff) != uVar12; uVar12 = uVar12 + 1) {
        pNVar7 = *(Node **)((long)&(((states->
                                     super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->locals).
                                   super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                   ._M_impl + lVar14);
        if (pNVar7->type != Bad) {
          pNVar7 = Node::makeCond((Node *)__range3,(Index)uVar12,pNVar7);
          pNVar7 = addNode(this,pNVar7);
        }
        Node::addValue((Node *)__range3,pNVar7);
        lVar14 = lVar14 + 0x20;
      }
    }
    pNVar7 = Node::makePhi((Node *)__range3,(Index)uVar13);
    pNVar7 = addNode(this,pNVar7);
    pFVar1 = (states->
             super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pFVar6 = (states->
                  super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                  )._M_impl.super__Vector_impl_data._M_start; pFVar6 != pFVar1; pFVar6 = pFVar6 + 1)
    {
      pNVar8 = expandFromI1(this,(pFVar6->locals).
                                 super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar13],(Expression *)0x0
                           );
      Node::addValue(pNVar7,pNVar8);
    }
    goto LAB_00818813;
  }
  (out->super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>)._M_impl
  .super__Vector_impl_data._M_start[uVar13] = pNVar8;
LAB_00818749:
  pFVar6 = pFVar6 + 1;
  pNVar7 = pNVar8;
  goto LAB_00818723;
}

Assistant:

void merge(std::vector<FlowState>& states, Locals& out) {
    // We should only receive reachable states.
#ifndef NDEBUG
    for (auto& state : states) {
      assert(!isInUnreachable(state.locals));
    }
#endif
    Index numStates = states.size();
    if (numStates == 0) {
      // We were unreachable, and still are.
      assert(isInUnreachable());
      return;
    }
    // We may have just become reachable, if we were not before.
    setInReachable();
    // Just one thing to merge is trivial.
    if (numStates == 1) {
      out = states[0].locals;
      return;
    }
    // We create a block if we need one.
    Index numLocals = func->getNumLocals();
    Node* block = nullptr;
    for (Index i = 0; i < numLocals; i++) {
      if (!isRelevantType(func->getLocalType(i))) {
        continue;
      }
      // Process the inputs. If any is bad, the phi is bad.
      bool bad = false;
      for (auto& state : states) {
        auto* node = state.locals[i];
        if (node->isBad()) {
          bad = true;
          out[i] = node;
          break;
        }
      }
      if (bad) {
        continue;
      }
      // Nothing is bad, proceed.
      Node* first = nullptr;
      for (auto& state : states) {
        if (!first) {
          first = out[i] = state.locals[i];
        } else if (state.locals[i] != first) {
          // We need to actually merge some stuff.
          if (!block) {
            block = addNode(Node::makeBlock());
            for (Index index = 0; index < numStates; index++) {
              auto* condition = states[index].condition;
              if (!condition->isBad()) {
                condition = addNode(Node::makeCond(block, index, condition));
              }
              block->addValue(condition);
            }
          }
          auto* phi = addNode(Node::makePhi(block, i));
          for (auto& state : states) {
            auto* value = expandFromI1(state.locals[i], nullptr);
            phi->addValue(value);
          }
          out[i] = phi;
          break;
        }
      }
    }
  }